

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_CanonicalizeUses_Test::TestBody(IsorecursiveTest_CanonicalizeUses_Test *this)

{
  initializer_list<unsigned_long> indices;
  initializer_list<unsigned_long> indices_00;
  initializer_list<unsigned_long> indices_01;
  initializer_list<unsigned_long> indices_02;
  initializer_list<unsigned_long> indices_03;
  initializer_list<unsigned_long> indices_04;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_9;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_8;
  Message local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_7;
  Message local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_6;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_5;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_4;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_3;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_2;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  unsigned_long local_228 [2];
  iterator local_218;
  undefined8 local_210;
  Struct local_208;
  Entry local_1f0;
  unsigned_long local_1e0 [2];
  iterator local_1d0;
  undefined8 local_1c8;
  Struct local_1c0;
  Entry local_1a8;
  unsigned_long local_198 [2];
  iterator local_188;
  undefined8 local_180;
  Struct local_178;
  Entry local_160;
  unsigned_long local_150 [2];
  iterator local_140;
  undefined8 local_138;
  Struct local_130;
  Entry local_118;
  unsigned_long local_108;
  iterator local_100;
  undefined8 local_f8;
  Struct local_f0;
  Entry local_d8;
  unsigned_long local_c8;
  iterator local_c0;
  undefined8 local_b8;
  Struct local_b0;
  Entry local_98;
  initializer_list<unsigned_long> local_88;
  Struct local_78;
  Entry local_60 [2];
  initializer_list<unsigned_long> local_40;
  Struct local_30;
  TypeBuilder local_18;
  TypeBuilder builder;
  IsorecursiveTest_CanonicalizeUses_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  wasm::TypeBuilder::TypeBuilder(&local_18,8);
  std::initializer_list<unsigned_long>::initializer_list(&local_40);
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_30,&this->super_IsorecursiveTest,&local_18,local_40);
  local_60[0] = wasm::TypeBuilder::operator[](&local_18,0);
  wasm::TypeBuilder::Entry::operator=(local_60,&local_30);
  wasm::Struct::~Struct(&local_30);
  std::initializer_list<unsigned_long>::initializer_list(&local_88);
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_78,&this->super_IsorecursiveTest,&local_18,local_88);
  local_98 = wasm::TypeBuilder::operator[](&local_18,1);
  wasm::TypeBuilder::Entry::operator=(&local_98,&local_78);
  wasm::Struct::~Struct(&local_78);
  local_c8 = 0;
  local_c0 = &local_c8;
  local_b8 = 1;
  indices_04._M_len = 1;
  indices_04._M_array = local_c0;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_b0,&this->super_IsorecursiveTest,&local_18,indices_04);
  local_d8 = wasm::TypeBuilder::operator[](&local_18,2);
  wasm::TypeBuilder::Entry::operator=(&local_d8,&local_b0);
  wasm::Struct::~Struct(&local_b0);
  local_108 = 1;
  local_100 = &local_108;
  local_f8 = 1;
  indices_03._M_len = 1;
  indices_03._M_array = local_100;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_f0,&this->super_IsorecursiveTest,&local_18,indices_03);
  local_118 = wasm::TypeBuilder::operator[](&local_18,3);
  wasm::TypeBuilder::Entry::operator=(&local_118,&local_f0);
  wasm::Struct::~Struct(&local_f0);
  local_150[0] = 0;
  local_150[1] = 2;
  local_140 = local_150;
  local_138 = 2;
  indices_02._M_len = 2;
  indices_02._M_array = local_140;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_130,&this->super_IsorecursiveTest,&local_18,indices_02);
  local_160 = wasm::TypeBuilder::operator[](&local_18,4);
  wasm::TypeBuilder::Entry::operator=(&local_160,&local_130);
  wasm::Struct::~Struct(&local_130);
  local_198[0] = 1;
  local_198[1] = 3;
  local_188 = local_198;
  local_180 = 2;
  indices_01._M_len = 2;
  indices_01._M_array = local_188;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_178,&this->super_IsorecursiveTest,&local_18,indices_01);
  local_1a8 = wasm::TypeBuilder::operator[](&local_18,5);
  wasm::TypeBuilder::Entry::operator=(&local_1a8,&local_178);
  wasm::Struct::~Struct(&local_178);
  local_1e0[0] = 2;
  local_1e0[1] = 4;
  local_1d0 = local_1e0;
  local_1c8 = 2;
  indices_00._M_len = 2;
  indices_00._M_array = local_1d0;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_1c0,&this->super_IsorecursiveTest,&local_18,indices_00);
  local_1f0 = wasm::TypeBuilder::operator[](&local_18,6);
  wasm::TypeBuilder::Entry::operator=(&local_1f0,&local_1c0);
  wasm::Struct::~Struct(&local_1c0);
  local_228[0] = 3;
  local_228[1] = 5;
  local_218 = local_228;
  local_210 = 2;
  indices._M_len = 2;
  indices._M_array = local_218;
  TypeSystemTest<(wasm::TypeSystem)0>::makeStruct
            (&local_208,&this->super_IsorecursiveTest,&local_18,indices);
  EVar5 = wasm::TypeBuilder::operator[](&local_18,7);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar5.builder;
  wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_208);
  wasm::Struct::~Struct(&local_208);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_268,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,(internal *)local_268,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2c8,"built[0]","built[1]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x188,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_2d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2e8,"built[2]","built[3]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x189,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,5);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_308,"built[4]","built[5]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x18a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_310);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,6);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,7);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_328,"built[6]","built[7]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x18b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_330);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_348,"built[0]","built[2]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar1) {
      testing::Message::Message(&local_350);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x18d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_350);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_368,"built[0]","built[4]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar1) {
      testing::Message::Message(&local_370);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x18e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_370);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,6);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_388,"built[0]","built[6]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,399,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_390);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_3a8,"built[2]","built[4]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,400,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_3b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,6);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_3c8,"built[2]","built[6]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
    if (!bVar1) {
      testing::Message::Message(&local_3d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x191,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_3d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,6);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_3e8,"built[4]","built[6]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x192,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeUses) {
  TypeBuilder builder(8);
  builder[0] = makeStruct(builder, {});
  builder[1] = makeStruct(builder, {});
  builder[2] = makeStruct(builder, {0});
  builder[3] = makeStruct(builder, {1});
  builder[4] = makeStruct(builder, {0, 2});
  builder[5] = makeStruct(builder, {1, 3});
  builder[6] = makeStruct(builder, {2, 4});
  builder[7] = makeStruct(builder, {3, 5});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[1]);
  EXPECT_EQ(built[2], built[3]);
  EXPECT_EQ(built[4], built[5]);
  EXPECT_EQ(built[6], built[7]);

  EXPECT_NE(built[0], built[2]);
  EXPECT_NE(built[0], built[4]);
  EXPECT_NE(built[0], built[6]);
  EXPECT_NE(built[2], built[4]);
  EXPECT_NE(built[2], built[6]);
  EXPECT_NE(built[4], built[6]);
}